

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

void reset_connection(cio_socket *socket)

{
  undefined8 uStack_18;
  int ret;
  linger linger;
  cio_socket *socket_local;
  
  uStack_18 = 1;
  linger = (linger)socket;
  setsockopt((socket->impl).ev.fd,1,0xd,&stack0xffffffffffffffe8,8);
  close_socket((cio_socket *)linger);
  return;
}

Assistant:

static void reset_connection(struct cio_socket *socket)
{
	struct linger linger = {.l_onoff = 1, .l_linger = 0};
	int ret = setsockopt(socket->impl.ev.fd, SOL_SOCKET, SO_LINGER, &linger, sizeof(linger));

	// Deliberately ignore the return value of setsockopt.
	// If setsockopt fails, we close the socket anyhow.
	(void)ret;
	close_socket(socket);
}